

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O1

QByteArray * QByteArray::fromHex(QByteArray *__return_storage_ptr__,QByteArray *hexEncoded)

{
  byte bVar1;
  Data *pDVar2;
  bool bVar3;
  long lVar4;
  byte *pbVar5;
  uint uVar6;
  
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray(__return_storage_ptr__,(hexEncoded->d).size + 1U >> 1,Uninitialized);
  pDVar2 = (__return_storage_ptr__->d).d;
  if ((pDVar2 == (Data *)0x0) ||
     (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    reallocData(__return_storage_ptr__,(__return_storage_ptr__->d).size,KeepSize);
  }
  pbVar5 = (byte *)((__return_storage_ptr__->d).ptr + (__return_storage_ptr__->d).size);
  lVar4 = (hexEncoded->d).size;
  if (lVar4 != 0) {
    lVar4 = lVar4 + 1;
    bVar3 = true;
    do {
      bVar1 = (hexEncoded->d).ptr[lVar4 + -2];
      uVar6 = bVar1 - 0x30;
      if (9 < uVar6) {
        if (bVar1 - 0x41 < 6) {
          uVar6 = bVar1 - 0x37;
        }
        else {
          uVar6 = bVar1 - 0x57;
          if (5 < bVar1 - 0x61) {
            uVar6 = 0xffffffff;
          }
        }
      }
      if (uVar6 != 0xffffffff) {
        if (bVar3) {
          pbVar5[-1] = (byte)uVar6;
          pbVar5 = pbVar5 + -1;
          bVar3 = false;
        }
        else {
          *pbVar5 = *pbVar5 | (byte)uVar6 << 4;
          bVar3 = true;
        }
      }
      lVar4 = lVar4 + -1;
    } while (1 < lVar4);
  }
  remove(__return_storage_ptr__,(char *)0x0);
  return __return_storage_ptr__;
}

Assistant:

QByteArray QByteArray::fromHex(const QByteArray &hexEncoded)
{
    QByteArray res((hexEncoded.size() + 1)/ 2, Qt::Uninitialized);
    uchar *result = (uchar *)res.data() + res.size();

    bool odd_digit = true;
    for (qsizetype i = hexEncoded.size() - 1; i >= 0; --i) {
        uchar ch = uchar(hexEncoded.at(i));
        int tmp = QtMiscUtils::fromHex(ch);
        if (tmp == -1)
            continue;
        if (odd_digit) {
            --result;
            *result = tmp;
            odd_digit = false;
        } else {
            *result |= tmp << 4;
            odd_digit = true;
        }
    }

    res.remove(0, result - (const uchar *)res.constData());
    return res;
}